

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void m68k_copy_line(TCGContext_conflict2 *tcg_ctx,TCGv_i32 dst,TCGv_i32 src,int index)

{
  TCGv_i32 ret;
  TCGv_i64 ret_00;
  TCGv_i64 ret_01;
  uintptr_t o;
  uintptr_t o_2;
  uintptr_t o_1;
  
  ret = tcg_temp_new_i32(tcg_ctx);
  ret_00 = tcg_temp_new_i64(tcg_ctx);
  ret_01 = tcg_temp_new_i64(tcg_ctx);
  tcg_gen_andi_i32_m68k(tcg_ctx,ret,src,-0x10);
  tcg_gen_qemu_ld64(tcg_ctx,ret_00,ret,index);
  tcg_gen_addi_i32_m68k(tcg_ctx,ret,ret,8);
  tcg_gen_qemu_ld64(tcg_ctx,ret_01,ret,index);
  tcg_gen_andi_i32_m68k(tcg_ctx,ret,dst,-0x10);
  tcg_gen_qemu_st64(tcg_ctx,ret_00,ret,index);
  tcg_gen_addi_i32_m68k(tcg_ctx,ret,ret,8);
  tcg_gen_qemu_st64(tcg_ctx,ret_01,ret,index);
  tcg_temp_free_internal_m68k(tcg_ctx,(TCGTemp *)(ret_00 + (long)tcg_ctx));
  tcg_temp_free_internal_m68k(tcg_ctx,(TCGTemp *)(ret_01 + (long)tcg_ctx));
  tcg_temp_free_internal_m68k(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
  return;
}

Assistant:

static void m68k_copy_line(TCGContext *tcg_ctx, TCGv dst, TCGv src, int index)
{
    TCGv addr;
    TCGv_i64 t0, t1;

    addr = tcg_temp_new(tcg_ctx);

    t0 = tcg_temp_new_i64(tcg_ctx);
    t1 = tcg_temp_new_i64(tcg_ctx);

    tcg_gen_andi_i32(tcg_ctx, addr, src, ~15);
    tcg_gen_qemu_ld64(tcg_ctx, t0, addr, index);
    tcg_gen_addi_i32(tcg_ctx, addr, addr, 8);
    tcg_gen_qemu_ld64(tcg_ctx, t1, addr, index);

    tcg_gen_andi_i32(tcg_ctx, addr, dst, ~15);
    tcg_gen_qemu_st64(tcg_ctx, t0, addr, index);
    tcg_gen_addi_i32(tcg_ctx, addr, addr, 8);
    tcg_gen_qemu_st64(tcg_ctx, t1, addr, index);

    tcg_temp_free_i64(tcg_ctx, t0);
    tcg_temp_free_i64(tcg_ctx, t1);
    tcg_temp_free(tcg_ctx, addr);
}